

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_GostR3410_2001_CryptoPro_B_ParamSet.c
# Opt level: O2

void point_add_mixed(pt_prj_t_conflict2 *R,pt_prj_t_conflict2 *Q,pt_aff_t_conflict2 *P)

{
  uint64_t *arg2;
  uint64_t *arg1;
  long lVar1;
  uint64_t *arg2_00;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_uint1 arg1_00;
  limb_t x1;
  ulong uVar2;
  fe_t_conflict1 t1;
  fe_t_conflict1 t0;
  fe_t_conflict1 t4;
  fe_t_conflict1 Z3;
  fe_t_conflict1 t3;
  fe_t_conflict1 t2;
  fe_t_conflict1 Y3;
  fe_t_conflict1 X3;
  
  arg2 = P->Y;
  uVar2 = 0;
  for (lVar1 = 10; lVar1 != 0x14; lVar1 = lVar1 + 1) {
    uVar2 = uVar2 | P->X[lVar1];
  }
  arg2_00 = Q->Z;
  arg1 = Q->Y;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t0,Q->X,P->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t1,arg1,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t3,P->X,arg2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t3,t3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t4,Q->X,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t4,t4);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t3,t3,t4);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t4,t0,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t4,t4);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(t3,t3,t4);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t3,t3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t4,arg2,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t4,t4,arg1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t4,t4);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Y3,P->X,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(Y3,Y3,Q->X);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Y3,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Z3,const_b,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(X3,Y3,Z3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(X3,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(Z3,X3,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Z3,Z3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(X3,X3,Z3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(X3,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(Z3,t1,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Z3,Z3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(X3,t1,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(X3,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Y3,const_b,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t1,arg2_00,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t1,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t2,t1,arg2_00);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t2,t2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(Y3,Y3,t2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Y3,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(Y3,Y3,t0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Y3,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t1,Y3,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t1,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(Y3,t1,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Y3,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t1,t0,t0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t1,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(t0,t1,t0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t0,t0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(t0,t0,t2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(t0,t0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t1,t4,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t2,t0,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Y3,X3,Z3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(Y3,Y3,t2);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Y3,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(X3,t3,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_sub(X3,X3,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(X3,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(Z3,t4,Z3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry_mul(t1,t3,t0);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_add(Z3,Z3,t1);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_carry(Z3,Z3);
  arg1_00 = (fiat_id_tc26_gost_3410_2012_512_paramSetA_uint1)uVar2;
  fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(R->X,arg1_00,Q->X,X3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(R->Y,arg1_00,arg1,Y3);
  fiat_id_tc26_gost_3410_2012_512_paramSetA_selectznz(R->Z,arg1_00,arg2_00,Z3);
  return;
}

Assistant:

static void point_add_mixed(pt_prj_t *R, const pt_prj_t *Q, const pt_aff_t *P) {
    /* temporary variables */
    fe_t t0, t1, t2, t3, t4;
    /* constants */
    const limb_t *b = const_b;
    /* set pointers for legacy curve arith */
    const limb_t *X1 = Q->X;
    const limb_t *Y1 = Q->Y;
    const limb_t *Z1 = Q->Z;
    const limb_t *X2 = P->X;
    const limb_t *Y2 = P->Y;
    fe_t X3;
    fe_t Y3;
    fe_t Z3;
    limb_t nz;

    /* check P for affine inf */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_nonzero(&nz, P->Y);

    /* the curve arith formula */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t0, X1, X2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t1, Y1, Y2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t3, X2, Y2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t4, X1, Y1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t3, t3, t4);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t4, t0, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(t3, t3, t4);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t4, Y2, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t4, t4, Y1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, X2, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, Y3, X1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, b, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(X3, Y3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, X3, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(X3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Z3, t1, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(X3, t1, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, b, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t1, Z1, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t2, t1, Z1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Y3, Y3, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(Y3, Y3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t1, Y3, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, t1, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t1, t0, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(t0, t1, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(t0, t0, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t1, t4, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t2, t0, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Y3, X3, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Y3, Y3, t2);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(X3, t3, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_sub(X3, X3, t1);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(Z3, t4, Z3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_mul(t1, t3, t0);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_add(Z3, Z3, t1);

    /* if P is inf, throw all that away and take Q */
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_selectznz(R->X, nz, Q->X, X3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_selectznz(R->Y, nz, Q->Y, Y3);
    fiat_id_GostR3410_2001_CryptoPro_B_ParamSet_selectznz(R->Z, nz, Q->Z, Z3);
}